

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall
testing::internal::ExpectationBase::UntypedTimes(ExpectationBase *this,Cardinality *a_cardinality)

{
  Clause CVar1;
  allocator<char> local_39;
  string local_38;
  
  CVar1 = this->last_clause_;
  if (CVar1 == kTimes) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,".Times() cannot appear more than once in an EXPECT_CALL().",
               &local_39);
    ExpectSpecProperty(this,false,&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               ".Times() cannot appear after .InSequence(), .WillOnce(), .WillRepeatedly(), or .RetiresOnSaturation()."
               ,&local_39);
    ExpectSpecProperty(this,(int)CVar1 < 2,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  this->last_clause_ = kTimes;
  SpecifyCardinality(this,a_cardinality);
  return;
}

Assistant:

void ExpectationBase::UntypedTimes(const Cardinality& a_cardinality) {
  if (last_clause_ == kTimes) {
    ExpectSpecProperty(false,
                       ".Times() cannot appear "
                       "more than once in an EXPECT_CALL().");
  } else {
    ExpectSpecProperty(last_clause_ < kTimes,
                       ".Times() cannot appear after "
                       ".InSequence(), .WillOnce(), .WillRepeatedly(), "
                       "or .RetiresOnSaturation().");
  }
  last_clause_ = kTimes;

  SpecifyCardinality(a_cardinality);
}